

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::WriteMultiLevelPlotfileHeaders
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode __a;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  Long LVar6;
  MultiFab **ppMVar7;
  int in_ESI;
  BoxArray *in_stack_00000008;
  BoxArray *in_stack_00000010;
  undefined8 in_stack_00000028;
  MultiFab *data;
  int level_1;
  int level;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  ofstream HeaderFile;
  string HeaderFileName;
  IO_Buffer io_buffer;
  string ed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool callBarrier;
  int finest_level;
  BoxArray *in_stack_fffffffffffffc28;
  BoxArray *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  _Ios_Openmode in_stack_fffffffffffffc84;
  undefined8 in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  string local_340 [32];
  MultiFab *local_320;
  int local_314;
  int local_310;
  string local_309 [6];
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  How in_stack_fffffffffffffdd4;
  string *in_stack_fffffffffffffdd8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffde0;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  ostream *in_stack_fffffffffffffdf8;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string local_f0 [39];
  allocator<char> local_c9 [41];
  string local_a0 [32];
  string local_80 [32];
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  undefined8 local_48;
  undefined1 local_3d;
  int local_3c;
  int local_c;
  
  local_3c = in_ESI + -1;
  local_3d = 0;
  local_c = in_ESI;
  PreBuildDirectorHierarchy
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffca0 >> 0x18,0));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffc40);
  if (!bVar1) {
    local_48 = in_stack_00000028;
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc28);
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc30,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc28), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
      std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::operator+(in_stack_fffffffffffffc38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc30);
      std::__cxx11::string::~string(local_a0);
      PreBuildDirectorHierarchy
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffca0 >> 0x18,0));
      std::__cxx11::string::~string(local_80);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    std::allocator<char>::allocator();
    Vector<char,_std::allocator<char>_>::vector
              ((Vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc30,
               (size_type)in_stack_fffffffffffffc28,(allocator_type *)0x12eaa39);
    std::allocator<char>::~allocator(local_c9);
    std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::ofstream::ofstream((void *)((long)&local_309[0].field_2 + 9));
    pcVar3 = (char *)std::ofstream::rdbuf();
    pcVar4 = Vector<char,_std::allocator<char>_>::dataPtr
                       ((Vector<char,_std::allocator<char>_> *)0x12eaa9e);
    Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0x12eaaad);
    std::streambuf::pubsetbuf(pcVar3,(long)pcVar4);
    in_stack_fffffffffffffc88 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_trunc);
    in_stack_fffffffffffffc84 = std::operator|(__a,_S_bin);
    std::ofstream::open(local_309[0].field_2._M_local_buf + 9,
                        (_Ios_Openmode)in_stack_fffffffffffffc88);
    bVar2 = std::ios::good();
    in_stack_fffffffffffffc80 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc80);
    if ((bVar2 & 1) == 0) {
      FileOpenFailed(in_stack_fffffffffffffc68);
    }
    in_stack_fffffffffffffc70 = (string *)(long)local_c;
    in_stack_fffffffffffffc78 = local_309;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x12eabe5);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28,
               (allocator_type *)0x12eabfc);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x12eac0b);
    local_310 = 0;
    while( true ) {
      lVar5 = (long)local_310;
      LVar6 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                        ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x12eac30);
      if (LVar6 <= lVar5) break;
      ppMVar7 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
      FabArrayBase::boxArray((FabArrayBase *)*ppMVar7);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
      BoxArray::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      local_310 = local_310 + 1;
    }
    WriteGenericPlotfileHeader
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
               (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffde0,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffdd8,
               (Real)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x12ead38);
    std::ofstream::~ofstream((void *)((long)&local_309[0].field_2 + 9));
    std::__cxx11::string::~string(local_f0);
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x12ead5f);
    in_stack_fffffffffffffc28 = in_stack_00000008;
    in_stack_fffffffffffffc30 = in_stack_00000010;
  }
  for (local_314 = 0; local_314 <= local_3c; local_314 = local_314 + 1) {
    ppMVar7 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
    local_320 = *ppMVar7;
    MultiFabFileFullPrefix
              ((int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
               (string *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    VisMF::WriteOnlyHeader
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
    std::__cxx11::string::~string(local_340);
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfileHeaders (const std::string & plotfilename, int nlevels,
                                const Vector<const MultiFab*> & mf,
                                const Vector<std::string>     & varnames,
                                const Vector<Geometry>        & geom,
                                Real time, const Vector<int>  & level_steps,
                                const Vector<IntVect>     & ref_ratio,
                                const std::string         & versionName,
                                const std::string         & levelPrefix,
                                const std::string         & mfPrefix,
                                const Vector<std::string> & extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                   geom, time, level_steps, ref_ratio, versionName, levelPrefix, mfPrefix);
    }

    for (int level = 0; level <= finest_level; ++level) {
        const MultiFab * data;
        data = mf[level];
        VisMF::WriteOnlyHeader(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

}